

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_fluent.cpp
# Opt level: O3

LocalizedNumberFormatter * __thiscall
icu_63::number::LocalizedNumberFormatter::operator=(LocalizedNumberFormatter *this,LNF *other)

{
  PluralRules *pPVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined4 uVar4;
  UNumberSignDisplay UVar5;
  long lVar6;
  Precision *pPVar7;
  Precision *pPVar8;
  SymbolsWrapper *this_00;
  byte bVar9;
  
  bVar9 = 0;
  (this->super_NumberFormatterSettings<icu_63::number::LocalizedNumberFormatter>).fMacros.notation.
  fUnion.scientific.fExponentSignDisplay =
       (other->super_NumberFormatterSettings<icu_63::number::LocalizedNumberFormatter>).fMacros.
       notation.fUnion.scientific.fExponentSignDisplay;
  *(undefined8 *)
   &(this->super_NumberFormatterSettings<icu_63::number::LocalizedNumberFormatter>).fMacros.notation
       = *(undefined8 *)
          &(other->super_NumberFormatterSettings<icu_63::number::LocalizedNumberFormatter>).fMacros.
           notation;
  MeasureUnit::operator=
            (&(this->super_NumberFormatterSettings<icu_63::number::LocalizedNumberFormatter>).
              fMacros.unit,
             &(other->super_NumberFormatterSettings<icu_63::number::LocalizedNumberFormatter>).
              fMacros.unit);
  MeasureUnit::operator=
            (&(this->super_NumberFormatterSettings<icu_63::number::LocalizedNumberFormatter>).
              fMacros.perUnit,
             &(other->super_NumberFormatterSettings<icu_63::number::LocalizedNumberFormatter>).
              fMacros.perUnit);
  pPVar7 = &(other->super_NumberFormatterSettings<icu_63::number::LocalizedNumberFormatter>).fMacros
            .precision;
  pPVar8 = &(this->super_NumberFormatterSettings<icu_63::number::LocalizedNumberFormatter>).fMacros.
            precision;
  for (lVar6 = 8; lVar6 != 0; lVar6 = lVar6 + -1) {
    uVar4 = *(undefined4 *)&pPVar7->field_0x4;
    pPVar8->fType = pPVar7->fType;
    *(undefined4 *)&pPVar8->field_0x4 = uVar4;
    pPVar7 = (Precision *)((long)pPVar7 + ((ulong)bVar9 * -2 + 1) * 8);
    pPVar8 = (Precision *)((long)pPVar8 + ((ulong)bVar9 * -2 + 1) * 8);
  }
  *(undefined4 *)
   ((long)&(this->super_NumberFormatterSettings<icu_63::number::LocalizedNumberFormatter>).fMacros.
           integerWidth.fUnion + 4) =
       *(undefined4 *)
        ((long)&(other->super_NumberFormatterSettings<icu_63::number::LocalizedNumberFormatter>).
                fMacros.integerWidth.fUnion + 4);
  (this->super_NumberFormatterSettings<icu_63::number::LocalizedNumberFormatter>).fMacros.
  integerWidth.fHasError =
       (other->super_NumberFormatterSettings<icu_63::number::LocalizedNumberFormatter>).fMacros.
       integerWidth.fHasError;
  if (this != other) {
    this_00 = &(this->super_NumberFormatterSettings<icu_63::number::LocalizedNumberFormatter>).
               fMacros.symbols;
    impl::SymbolsWrapper::doCleanup(this_00);
    impl::SymbolsWrapper::doCopyFrom
              (this_00,&(other->
                        super_NumberFormatterSettings<icu_63::number::LocalizedNumberFormatter>).
                        fMacros.symbols);
  }
  (this->super_NumberFormatterSettings<icu_63::number::LocalizedNumberFormatter>).fMacros.decimal =
       (other->super_NumberFormatterSettings<icu_63::number::LocalizedNumberFormatter>).fMacros.
       decimal;
  UVar5 = (other->super_NumberFormatterSettings<icu_63::number::LocalizedNumberFormatter>).fMacros.
          sign;
  (this->super_NumberFormatterSettings<icu_63::number::LocalizedNumberFormatter>).fMacros.unitWidth
       = (other->super_NumberFormatterSettings<icu_63::number::LocalizedNumberFormatter>).fMacros.
         unitWidth;
  (this->super_NumberFormatterSettings<icu_63::number::LocalizedNumberFormatter>).fMacros.sign =
       UVar5;
  Scale::operator=(&(this->super_NumberFormatterSettings<icu_63::number::LocalizedNumberFormatter>).
                    fMacros.scale,
                   &(other->super_NumberFormatterSettings<icu_63::number::LocalizedNumberFormatter>)
                    .fMacros.scale);
  pPVar1 = (other->super_NumberFormatterSettings<icu_63::number::LocalizedNumberFormatter>).fMacros.
           rules;
  uVar2 = *(undefined8 *)
           ((long)&(other->super_NumberFormatterSettings<icu_63::number::LocalizedNumberFormatter>).
                   fMacros.rules + 4);
  uVar3 = *(undefined8 *)
           ((long)&(other->super_NumberFormatterSettings<icu_63::number::LocalizedNumberFormatter>).
                   fMacros.currencySymbols + 4);
  (this->super_NumberFormatterSettings<icu_63::number::LocalizedNumberFormatter>).fMacros.
  affixProvider =
       (other->super_NumberFormatterSettings<icu_63::number::LocalizedNumberFormatter>).fMacros.
       affixProvider;
  (this->super_NumberFormatterSettings<icu_63::number::LocalizedNumberFormatter>).fMacros.rules =
       pPVar1;
  *(undefined8 *)
   ((long)&(this->super_NumberFormatterSettings<icu_63::number::LocalizedNumberFormatter>).fMacros.
           rules + 4) = uVar2;
  *(undefined8 *)
   ((long)&(this->super_NumberFormatterSettings<icu_63::number::LocalizedNumberFormatter>).fMacros.
           currencySymbols + 4) = uVar3;
  Locale::operator=(&(this->super_NumberFormatterSettings<icu_63::number::LocalizedNumberFormatter>)
                     .fMacros.locale,
                    &(other->super_NumberFormatterSettings<icu_63::number::LocalizedNumberFormatter>
                     ).fMacros.locale);
  clear(this);
  return this;
}

Assistant:

LocalizedNumberFormatter& LocalizedNumberFormatter::operator=(const LNF& other) {
    NFS<LNF>::operator=(static_cast<const NFS<LNF>&>(other));
    // Reset to default values.
    clear();
    return *this;
}